

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O2

void __thiscall
indigox::algorithm::AStarOptimisation::CalculateHeuristicEnergy
          (AStarOptimisation *this,p_AStarQueueItem *d)

{
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (Options::AssignElectrons::AStar::HEURISTIC == ABSTEMIOUS) {
    std::__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_38,
               &d->
                super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>);
    AbstemiousHeuristic(this,(p_AStarQueueItem *)&_Stack_38);
    p_Var1 = &_Stack_38;
  }
  else {
    if (Options::AssignElectrons::AStar::HEURISTIC != PROMISCUOUS) {
      ((d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->heuristic_cost = 0;
      return;
    }
    std::__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,
               &d->
                super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>);
    PromiscuousHeuristic(this,(p_AStarQueueItem *)&local_28);
    p_Var1 = &local_28;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return;
}

Assistant:

void AStarOptimisation::CalculateHeuristicEnergy(p_AStarQueueItem d) {
  if (opt_as::HEURISTIC == opt_as::Heuristic::PROMISCUOUS)
    PromiscuousHeuristic(d);
  else if (opt_as::HEURISTIC == opt_as::Heuristic::ABSTEMIOUS)
    AbstemiousHeuristic(d);
  else
    d->heuristic_cost = 0;
}